

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1502.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  long lStack_290;
  uint __i;
  long curl_timeo;
  undefined1 local_280 [4];
  int maxfd;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  undefined1 auStack_f8 [4];
  int rc;
  timeval timeout;
  curl_slist *dns_cache_list;
  int *piStack_d8;
  int msgs_left;
  CURLMsg *msg;
  int still_running;
  CURLcode result;
  char redirect [160];
  CURLM *multi_handle;
  CURL *ehandle;
  char *URL_local;
  
  msg._4_4_ = 4;
  sprintf((char *)&still_running,"google.com:%s:%s",libtest_arg2,libtest_arg3);
  fprintf(_stderr,"Redirect: %s\n",&still_running);
  timeout.tv_usec = curl_slist_append(0,&still_running);
  uVar2 = curl_easy_init();
  curl_easy_setopt(uVar2,0x2712,URL);
  curl_easy_setopt(uVar2,0x2a,1);
  curl_easy_setopt(uVar2,0x27db,timeout.tv_usec);
  uVar3 = curl_multi_init();
  curl_multi_add_handle(uVar3,uVar2);
  curl_multi_perform(uVar3,&msg);
  do {
    curl_timeo._4_4_ = -1;
    lStack_290 = -1;
    for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
      fdwrite.__fds_bits[(ulong)__arr._4_4_ + 0xf] = 0;
    }
    for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
      fdexcep.__fds_bits[(ulong)__arr_1._4_4_ + 0xf] = 0;
    }
    for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10; __arr_2._4_4_ = __arr_2._4_4_ + 1) {
      *(undefined8 *)(local_280 + (ulong)__arr_2._4_4_ * 8) = 0;
    }
    _auStack_f8 = 1;
    timeout.tv_sec = 0;
    curl_multi_timeout(uVar3,&stack0xfffffffffffffd70);
    if (-1 < lStack_290) {
      _auStack_f8 = lStack_290 / 1000;
      if (_auStack_f8 < 2) {
        timeout.tv_sec = (lStack_290 % 1000) * 1000;
      }
      else {
        _auStack_f8 = 1;
      }
    }
    curl_multi_fdset(uVar3);
    iVar1 = select(curl_timeo._4_4_ + 1,(fd_set *)(fdwrite.__fds_bits + 0xf),
                   (fd_set *)(fdexcep.__fds_bits + 0xf),(fd_set *)local_280,(timeval *)auStack_f8);
    if (iVar1 != -1) {
      curl_multi_perform(uVar3,&msg);
    }
  } while ((int)msg != 0);
  while (piStack_d8 = (int *)curl_multi_info_read(uVar3,(long)&dns_cache_list + 4),
        piStack_d8 != (int *)0x0) {
    if (*piStack_d8 == 1) {
      msg._4_4_ = piStack_d8[4];
    }
  }
  curl_multi_cleanup(uVar3);
  curl_easy_cleanup(uVar2);
  curl_slist_free_all(timeout.tv_usec);
  return msg._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *ehandle;
  CURLM *multi_handle;
  char redirect[160];
  CURLcode result = CURLE_NOT_BUILT_IN;
  int still_running; /* keep number of running handles */

  CURLMsg *msg; /* for picking up messages with the transfer status */
  int msgs_left; /* how many messages are left */

  /* DNS cache injection */
  struct curl_slist *dns_cache_list;

  sprintf(redirect, "google.com:%s:%s", libtest_arg2, libtest_arg3);

  fprintf(stderr, "Redirect: %s\n", redirect);

  dns_cache_list = curl_slist_append(NULL, redirect);

  /* Allocate one CURL handle per transfer */
  ehandle = curl_easy_init();

  /* set the options (I left out a few, you'll get the point anyway) */
  curl_easy_setopt(ehandle, CURLOPT_URL, URL);
  curl_easy_setopt(ehandle, CURLOPT_HEADER, 1L);

  curl_easy_setopt(ehandle, CURLOPT_RESOLVE, dns_cache_list);

  /* init a multi stack */
  multi_handle = curl_multi_init();

  /* add the individual transfers */
  curl_multi_add_handle(multi_handle, ehandle);

  /* we start some action by calling perform right away */
  curl_multi_perform(multi_handle, &still_running);

  do {
    struct timeval timeout;
    int rc; /* select() return code */

    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    int maxfd = -1;

    long curl_timeo = -1;

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    /* set a suitable timeout to play around with */
    timeout.tv_sec = 1;
    timeout.tv_usec = 0;

    curl_multi_timeout(multi_handle, &curl_timeo);
    if(curl_timeo >= 0) {
      timeout.tv_sec = curl_timeo / 1000;
      if(timeout.tv_sec > 1)
        timeout.tv_sec = 1;
      else
        timeout.tv_usec = (curl_timeo % 1000) * 1000;
    }

    /* get file descriptors from the transfers */
    curl_multi_fdset(multi_handle, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* In a real-world program you OF COURSE check the return code of the
       function calls.  On success, the value of maxfd is guaranteed to be
       greater or equal than -1.  We call select(maxfd + 1, ...), specially in
       case of (maxfd == -1), we call select(0, ...), which is basically equal
       to sleep. */

    rc = select(maxfd+1, &fdread, &fdwrite, &fdexcep, &timeout);

    switch(rc) {
    case -1:
      /* select error */
      break;
    case 0: /* timeout */
    default: /* action */
      curl_multi_perform(multi_handle, &still_running);
      break;
    }
  } while(still_running);

  /* See how the transfers went */
  while ((msg = curl_multi_info_read(multi_handle, &msgs_left))) {
    if (msg->msg == CURLMSG_DONE)
      result = msg->data.result;
  }

  curl_multi_cleanup(multi_handle);

  /* Free the CURL handles */
  curl_easy_cleanup(ehandle);

  curl_slist_free_all(dns_cache_list);

  return (int)result;
}